

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattice.c
# Opt level: O0

void WebRtcIsac_NormLatticeFilterMa
               (int orderCoef,float *stateF,float *stateG,float *lat_in,double *filtcoeflo,
               double *lat_out)

{
  int iVar1;
  float local_119c;
  float local_1198;
  float gain1;
  float g [13] [40];
  float f [13] [40];
  double a [13];
  float afStack_e8 [2];
  float inv_cth [12];
  float cth [12];
  float sth [12];
  int ord_1;
  int temp1;
  int u;
  int i;
  int k;
  int n;
  double *lat_out_local;
  double *filtcoeflo_local;
  float *lat_in_local;
  float *stateG_local;
  float *stateF_local;
  int orderCoef_local;
  
  iVar1 = orderCoef + 1;
  for (ord_1 = 0; ord_1 < 6; ord_1 = ord_1 + 1) {
    f[0xc][0x26] = 0.0;
    f[0xc][0x27] = 1.875;
    memcpy(a,filtcoeflo + (long)(ord_1 * iVar1) + 1,(long)orderCoef << 3);
    WebRtcIsac_Dir2Lat((double *)(f[0xc] + 0x26),orderCoef,cth + 10,inv_cth + 10);
    local_119c = (float)filtcoeflo[ord_1 * iVar1];
    for (u = 0; u < orderCoef; u = u + 1) {
      local_119c = inv_cth[(long)u + 10] * local_119c;
      afStack_e8[u] = 1.0 / inv_cth[(long)u + 10];
    }
    for (temp1 = 0; temp1 < 0x28; temp1 = temp1 + 1) {
      f[-1][(long)temp1 + 0x26] = lat_in[temp1 + ord_1 * 0x28];
      (&local_1198)[temp1] = lat_in[temp1 + ord_1 * 0x28];
    }
    for (temp1 = 1; temp1 < iVar1; temp1 = temp1 + 1) {
      g[(long)temp1 + 0xc][0x26] =
           afStack_e8[temp1 + -1] *
           (cth[(long)(temp1 + -1) + 10] * stateG[temp1 + -1] + g[(long)(temp1 + -1) + 0xc][0x26]);
      (&local_1198)[(long)temp1 * 0x28] =
           inv_cth[(long)(temp1 + -1) + 10] * stateG[temp1 + -1] +
           cth[(long)(temp1 + -1) + 10] * g[(long)temp1 + 0xc][0x26];
    }
    for (u = 0; u < orderCoef; u = u + 1) {
      for (i = 0; i < 0x27; i = i + 1) {
        g[(long)(u + 1) + 0xc][(long)(i + 1) + 0x26] =
             afStack_e8[u] *
             (cth[(long)u + 10] * (&local_1198)[(long)u * 0x28 + (long)i] +
             g[(long)u + 0xc][(long)(i + 1) + 0x26]);
        (&local_1198)[(long)(u + 1) * 0x28 + (long)(i + 1)] =
             inv_cth[(long)u + 10] * (&local_1198)[(long)u * 0x28 + (long)i] +
             cth[(long)u + 10] * g[(long)(u + 1) + 0xc][(long)(i + 1) + 0x26];
      }
    }
    for (i = 0; i < 0x28; i = i + 1) {
      lat_out[i + ord_1 * 0x28] = (double)(local_119c * g[(long)orderCoef + 0xc][(long)i + 0x26]);
    }
    for (temp1 = 0; temp1 < iVar1; temp1 = temp1 + 1) {
      stateF[temp1] = f[temp1][0x25];
      stateG[temp1] = g[temp1][0x25];
    }
  }
  return;
}

Assistant:

void WebRtcIsac_NormLatticeFilterMa(int orderCoef,
                                     float *stateF,
                                     float *stateG,
                                     float *lat_in,
                                     double *filtcoeflo,
                                     double *lat_out)
{
  int n,k,i,u,temp1;
  int ord_1 = orderCoef+1;
  float sth[MAX_AR_MODEL_ORDER];
  float cth[MAX_AR_MODEL_ORDER];
  float inv_cth[MAX_AR_MODEL_ORDER];
  double a[MAX_AR_MODEL_ORDER+1];
  float f[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN], g[MAX_AR_MODEL_ORDER+1][HALF_SUBFRAMELEN];
  float gain1;

  for (u=0;u<SUBFRAMES;u++)
  {
    /* set the Direct Form coefficients */
    temp1 = u*ord_1;
    a[0] = 1;
    memcpy(a+1, filtcoeflo+temp1+1, sizeof(double) * (ord_1-1));

    /* compute lattice filter coefficients */
    WebRtcIsac_Dir2Lat(a,orderCoef,sth,cth);

    /* compute the gain */
    gain1 = (float)filtcoeflo[temp1];
    for (k=0;k<orderCoef;k++)
    {
      gain1 *= cth[k];
      inv_cth[k] = 1/cth[k];
    }

    /* normalized lattice filter */
    /*****************************/

    /* initial conditions */
    for (i=0;i<HALF_SUBFRAMELEN;i++)
    {
      f[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
      g[0][i] = lat_in[i + u * HALF_SUBFRAMELEN];
    }

    /* get the state of f&g for the first input, for all orders */
    for (i=1;i<ord_1;i++)
    {
      f[i][0] = inv_cth[i-1]*(f[i-1][0] + sth[i-1]*stateG[i-1]);
      g[i][0] = cth[i-1]*stateG[i-1] + sth[i-1]* f[i][0];
    }

    /* filtering */
    for(k=0;k<orderCoef;k++)
    {
      for(n=0;n<(HALF_SUBFRAMELEN-1);n++)
      {
        f[k+1][n+1] = inv_cth[k]*(f[k][n+1] + sth[k]*g[k][n]);
        g[k+1][n+1] = cth[k]*g[k][n] + sth[k]* f[k+1][n+1];
      }
    }

    for(n=0;n<HALF_SUBFRAMELEN;n++)
    {
      lat_out[n + u * HALF_SUBFRAMELEN] = gain1 * f[orderCoef][n];
    }

    /* save the states */
    for (i=0;i<ord_1;i++)
    {
      stateF[i] = f[i][HALF_SUBFRAMELEN-1];
      stateG[i] = g[i][HALF_SUBFRAMELEN-1];
    }
    /* process next frame */
  }

  return;
}